

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O0

int getargs(HSQUIRRELVM v,int argc,char **argv,SQInteger *retval)

{
  bool bVar1;
  SQObjectType SVar2;
  SQRESULT SVar3;
  undefined8 *in_RCX;
  long in_RDX;
  int in_ESI;
  HSQUIRRELVM in_RDI;
  SQChar *err;
  SQObjectType type;
  SQChar *a;
  int callargs;
  SQChar *outfile;
  SQChar *filename;
  int exitloop;
  int arg;
  char *output;
  int compiles_only;
  int i;
  SQBool in_stack_000007b8;
  SQChar *in_stack_000007c0;
  HSQUIRRELVM in_stack_000007c8;
  SQChar **in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar4;
  SQInteger in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQBool retval_00;
  int iVar6;
  int iVar7;
  HSQUIRRELVM v_00;
  int local_2c;
  
  bVar1 = false;
  v_00 = (HSQUIRRELVM)0x0;
  *in_RCX = 0;
  if (1 < in_ESI) {
    iVar7 = 1;
    iVar6 = 0;
    while( true ) {
      bVar4 = 0;
      if (iVar7 < in_ESI) {
        bVar4 = iVar6 != 0 ^ 0xff;
      }
      if (((bVar4 & 1) == 0) || (**(char **)(in_RDX + (long)iVar7 * 8) != '-')) break;
      in_stack_ffffffffffffff80 =
           (HSQUIRRELVM)(ulong)((int)*(char *)(*(long *)(in_RDX + (long)iVar7 * 8) + 1) - 99);
      switch(in_stack_ffffffffffffff80) {
      case (HSQUIRRELVM)0x0:
        bVar1 = true;
        break;
      case (HSQUIRRELVM)0x1:
        sq_enabledebuginfo(in_RDI,1);
        break;
      default:
        PrintVersionInfos();
        printf("unknown prameter \'-%c\'\n",
               (ulong)(uint)(int)*(char *)(*(long *)(in_RDX + (long)iVar7 * 8) + 1));
        PrintUsage();
        *in_RCX = 0xffffffffffffffff;
        return 3;
      case (HSQUIRRELVM)0x5:
        PrintVersionInfos();
        PrintUsage();
        return 2;
      case (HSQUIRRELVM)0xc:
        if (iVar7 < in_ESI) {
          iVar7 = iVar7 + 1;
          v_00 = *(HSQUIRRELVM *)(in_RDX + (long)iVar7 * 8);
        }
        break;
      case (HSQUIRRELVM)0x13:
        PrintVersionInfos();
        return 2;
      }
      iVar7 = iVar7 + 1;
    }
    if (iVar7 < in_ESI) {
      retval_00 = *(SQBool *)(in_RDX + (long)iVar7 * 8);
      iVar7 = iVar7 + 1;
      if (bVar1) {
        SVar3 = sqstd_loadfile(in_stack_000007c8,in_stack_000007c0,in_stack_000007b8);
        if ((-1 < SVar3) &&
           (SVar3 = sqstd_writeclosuretofile
                              ((HSQUIRRELVM)CONCAT17(bVar4,in_stack_ffffffffffffff88),
                               (SQChar *)in_stack_ffffffffffffff80), -1 < SVar3)) {
          return 2;
        }
      }
      else {
        SVar3 = sqstd_loadfile(in_stack_000007c8,in_stack_000007c0,in_stack_000007b8);
        if (-1 < SVar3) {
          iVar5 = 1;
          sq_pushroottable((HSQUIRRELVM)0x113a15);
          for (local_2c = iVar7; local_2c < in_ESI; local_2c = local_2c + 1) {
            sq_pushstring(in_stack_ffffffffffffffb0,
                          (SQChar *)CONCAT44(iVar5,in_stack_ffffffffffffffa8),
                          *(SQInteger *)(in_RDX + (long)local_2c * 8));
            iVar5 = iVar5 + 1;
          }
          SVar3 = sq_call(v_00,CONCAT44(iVar7,iVar6),retval_00,(SQBool)in_stack_ffffffffffffffb0);
          if (-1 < SVar3) {
            SVar2 = sq_gettype(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
            if (SVar2 == OT_INTEGER) {
              *in_RCX = 0x5000002;
              sq_getinteger((HSQUIRRELVM)CONCAT44(0x5000002,in_stack_ffffffffffffff98),
                            in_stack_ffffffffffffff90,
                            (SQInteger *)CONCAT17(bVar4,in_stack_ffffffffffffff88));
            }
            return 2;
          }
          return 3;
        }
      }
      sq_getlasterror((HSQUIRRELVM)0x113aee);
      SVar3 = sq_getstring((HSQUIRRELVM)CONCAT17(bVar4,in_stack_ffffffffffffff88),
                           (SQInteger)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (-1 < SVar3) {
        printf("Error [%s]\n",in_stack_ffffffffffffff90);
        *in_RCX = 0xfffffffffffffffe;
        return 3;
      }
    }
  }
  return 0;
}

Assistant:

int getargs(HSQUIRRELVM v,int argc, char* argv[],SQInteger *retval)
{
    int i;
    int compiles_only = 0;
#ifdef SQUNICODE
    static SQChar temp[500];
#endif
    char * output = NULL;
    *retval = 0;
    if(argc>1)
    {
        int arg=1,exitloop=0;

        while(arg < argc && !exitloop)
        {

            if(argv[arg][0]=='-')
            {
                switch(argv[arg][1])
                {
                case 'd': //DEBUG(debug infos)
                    sq_enabledebuginfo(v,1);
                    break;
                case 'c':
                    compiles_only = 1;
                    break;
                case 'o':
                    if(arg < argc) {
                        arg++;
                        output = argv[arg];
                    }
                    break;
                case 'v':
                    PrintVersionInfos();
                    return _DONE;

                case 'h':
                    PrintVersionInfos();
                    PrintUsage();
                    return _DONE;
                default:
                    PrintVersionInfos();
                    scprintf(_SC("unknown prameter '-%c'\n"),argv[arg][1]);
                    PrintUsage();
                    *retval = -1;
                    return _ERROR;
                }
            }else break;
            arg++;
        }

        // src file

        if(arg<argc) {
            const SQChar *filename=NULL;
#ifdef SQUNICODE
            mbstowcs(temp,argv[arg],strlen(argv[arg]));
            filename=temp;
#else
            filename=argv[arg];
#endif

            arg++;

            //sq_pushstring(v,_SC("ARGS"),-1);
            //sq_newarray(v,0);

            //sq_createslot(v,-3);
            //sq_pop(v,1);
            if(compiles_only) {
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))){
                    const SQChar *outfile = _SC("out.cnut");
                    if(output) {
#ifdef SQUNICODE
                        int len = (int)(strlen(output)+1);
                        mbstowcs(sq_getscratchpad(v,len*sizeof(SQChar)),output,len);
                        outfile = sq_getscratchpad(v,-1);
#else
                        outfile = output;
#endif
                    }
                    if(SQ_SUCCEEDED(sqstd_writeclosuretofile(v,outfile)))
                        return _DONE;
                }
            }
            else {
                //if(SQ_SUCCEEDED(sqstd_dofile(v,filename,SQFalse,SQTrue))) {
                    //return _DONE;
                //}
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))) {
                    int callargs = 1;
                    sq_pushroottable(v);
                    for(i=arg;i<argc;i++)
                    {
                        const SQChar *a;
#ifdef SQUNICODE
                        int alen=(int)strlen(argv[i]);
                        a=sq_getscratchpad(v,(int)(alen*sizeof(SQChar)));
                        mbstowcs(sq_getscratchpad(v,-1),argv[i],alen);
                        sq_getscratchpad(v,-1)[alen] = _SC('\0');
#else
                        a=argv[i];
#endif
                        sq_pushstring(v,a,-1);
                        callargs++;
                        //sq_arrayappend(v,-2);
                    }
                    if(SQ_SUCCEEDED(sq_call(v,callargs,SQTrue,SQTrue))) {
                        SQObjectType type = sq_gettype(v,-1);
                        if(type == OT_INTEGER) {
                            *retval = type;
                            sq_getinteger(v,-1,retval);
                        }
                        return _DONE;
                    }
                    else{
                        return _ERROR;
                    }

                }
            }
            //if this point is reached an error occurred
            {
                const SQChar *err;
                sq_getlasterror(v);
                if(SQ_SUCCEEDED(sq_getstring(v,-1,&err))) {
                    scprintf(_SC("Error [%s]\n"),err);
                    *retval = -2;
                    return _ERROR;
                }
            }

        }
    }

    return _INTERACTIVE;
}